

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testGenerator.h
# Opt level: O2

void generateSomeValues(size_t size,vector<int,_std::allocator<int>_> *arr)

{
  result_type rVar1;
  size_t i;
  size_t sVar2;
  mt19937 generator;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  mStack_13a8;
  
  rVar1 = time((time_t *)0x0);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&mStack_13a8,rVar1);
  std::vector<int,_std::allocator<int>_>::resize(arr,size);
  for (sVar2 = 0; size != sVar2; sVar2 = sVar2 + 1) {
    rVar1 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&mStack_13a8);
    (arr->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
    [sVar2] = (int)rVar1;
  }
  return;
}

Assistant:

void generateSomeValues(size_t size, std::vector<int>& arr) {
    std::mt19937 generator(time(0));

    arr.resize(size);

    for (size_t i = 0; i < size; i++)
        arr[i] = generator();
}